

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_parse(int argc,char **argv,void **argtable)

{
  char *pcVar1;
  arg_end *endtable;
  code *pcVar2;
  void *pvVar3;
  long lVar4;
  char **nargv;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  int *__ptr;
  size_t sVar9;
  byte *pbVar10;
  void **ppvVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  byte bVar17;
  char cVar18;
  long lVar19;
  void *pvVar20;
  arg_hdr **table;
  int iVar21;
  
  ppvVar11 = argtable;
  do {
    pbVar10 = (byte *)*ppvVar11;
    if (*(code **)(pbVar10 + 0x38) != (code *)0x0) {
      (**(code **)(pbVar10 + 0x38))(*(undefined8 *)(pbVar10 + 0x30));
      pbVar10 = (byte *)*ppvVar11;
    }
    ppvVar11 = ppvVar11 + 1;
  } while ((*pbVar10 & 1) == 0);
  lVar4 = -0x100000000;
  ppvVar11 = argtable;
  do {
    pbVar10 = (byte *)*ppvVar11;
    lVar4 = lVar4 + 0x100000000;
    ppvVar11 = ppvVar11 + 1;
  } while ((*pbVar10 & 1) == 0);
  endtable = *(arg_end **)((long)argtable + (lVar4 >> 0x1d));
  if (argc == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable);
LAB_00106e5e:
    return endtable->count;
  }
  nargv = (char **)malloc((long)argc * 8 + 8);
  if (nargv == (char **)0x0) {
    arg_register_error(endtable,endtable,2,(char *)0x0);
    goto LAB_00106e5e;
  }
  uVar5 = 0;
  uVar12 = 0;
  if (0 < argc) {
    uVar12 = (ulong)(uint)argc;
  }
  for (; uVar12 != uVar5; uVar5 = uVar5 + 1) {
    nargv[uVar5] = argv[uVar5];
  }
  nargv[argc] = (char *)0x0;
  iVar21 = 1;
  lVar14 = 0;
  lVar4 = 0;
  do {
    lVar6 = lVar4;
    pbVar10 = (byte *)argtable[lVar14];
    pcVar8 = *(char **)(pbVar10 + 0x10);
    lVar19 = 1;
    if (pcVar8 != (char *)0x0) {
      sVar7 = strlen(pcVar8);
      lVar19 = sVar7 + 1;
    }
    uVar5 = (long)iVar21 << 5 | 0x10;
    while (pcVar8 != (char *)0x0) {
      iVar21 = iVar21 + 1;
      pcVar8 = strchr(pcVar8 + 1,0x2c);
      uVar5 = uVar5 + 0x20;
    }
    lVar14 = lVar14 + 1;
    lVar4 = lVar6 + lVar19;
  } while ((*pbVar10 & 1) == 0);
  __ptr = (int *)malloc(lVar19 + lVar6 + uVar5);
  if (__ptr != (int *)0x0) {
    *__ptr = 0;
    __ptr[1] = iVar21;
    piVar13 = __ptr + 4;
    *(int **)(__ptr + 2) = piVar13;
    pcVar8 = (char *)(uVar5 + (long)__ptr);
    lVar14 = 0;
    lVar4 = 0;
    while( true ) {
      lVar4 = (long)(int)lVar4;
      if ((*argtable[lVar14] & 1) != 0) break;
      for (pcVar15 = *(char **)((long)argtable[lVar14] + 0x10);
          (pcVar15 != (char *)0x0 && (cVar18 = *pcVar15, pcVar16 = pcVar8, cVar18 != '\0'));
          pcVar15 = pcVar15 + (cVar18 == ',')) {
        while ((cVar18 != '\0' && (cVar18 != ','))) {
          *pcVar16 = cVar18;
          pcVar1 = pcVar15 + 1;
          pcVar15 = pcVar15 + 1;
          pcVar16 = pcVar16 + 1;
          cVar18 = *pcVar1;
        }
        *pcVar16 = '\0';
        cVar18 = *pcVar15;
        piVar13 = *(int **)(__ptr + 2);
        *(char **)(piVar13 + lVar4 * 8) = pcVar8;
        *(int **)(piVar13 + lVar4 * 8 + 4) = __ptr;
        piVar13[lVar4 * 8 + 6] = (int)lVar14;
        if ((*argtable[lVar14] & 4) == 0) {
          if ((*argtable[lVar14] & 2) == 0) {
            piVar13[lVar4 * 8 + 2] = 0;
          }
          else {
            piVar13[lVar4 * 8 + 2] = 1;
          }
        }
        else {
          piVar13[lVar4 * 8 + 2] = 2;
        }
        lVar4 = lVar4 + 1;
        pcVar8 = pcVar16 + 1;
      }
      lVar14 = lVar14 + 1;
    }
    (piVar13 + lVar4 * 8)[0] = 0;
    (piVar13 + lVar4 * 8)[1] = 0;
    piVar13[lVar4 * 8 + 2] = 0;
    (piVar13 + lVar4 * 8 + 4)[0] = 0;
    (piVar13 + lVar4 * 8 + 4)[1] = 0;
    piVar13[lVar4 * 8 + 6] = 0;
  }
  sVar7 = 2;
  for (ppvVar11 = argtable; (**ppvVar11 & 1) == 0; ppvVar11 = ppvVar11 + 1) {
    pcVar8 = *(char **)((long)*ppvVar11 + 8);
    if (pcVar8 == (char *)0x0) {
      lVar4 = 0;
    }
    else {
      sVar9 = strlen(pcVar8);
      lVar4 = sVar9 * 3;
    }
    sVar7 = sVar7 + lVar4;
  }
  pcVar8 = (char *)malloc(sVar7);
  if (pcVar8 != (char *)0x0) {
    pcVar15 = pcVar8 + 1;
    *pcVar8 = ':';
    lVar4 = 0;
    while (pbVar10 = (byte *)argtable[lVar4], (*pbVar10 & 1) == 0) {
      pcVar16 = *(char **)(pbVar10 + 8);
      while ((pcVar16 != (char *)0x0 && (*pcVar16 != '\0'))) {
        *pcVar15 = *pcVar16;
        bVar17 = *pbVar10;
        if ((bVar17 & 2) == 0) {
          pcVar15 = pcVar15 + 1;
        }
        else {
          pcVar15[1] = ':';
          pcVar15 = pcVar15 + 2;
          bVar17 = *pbVar10;
        }
        pcVar16 = pcVar16 + 1;
        if ((bVar17 & 4) != 0) {
          *pcVar15 = ':';
          pcVar15 = pcVar15 + 1;
        }
      }
      lVar4 = lVar4 + 1;
    }
    *pcVar15 = '\0';
    if (__ptr != (int *)0x0) {
      optind = 0;
      opterr = 0;
LAB_00106b5b:
      iVar21 = getopt_long(argc,nargv,pcVar8,*(option **)(__ptr + 2),(int *)0x0);
      if (iVar21 == 0) {
        iVar21 = *__ptr;
        pbVar10 = (byte *)argtable[iVar21];
        pvVar20 = *(void **)(pbVar10 + 0x30);
        if (((optarg != (char *)0x0) && (*optarg == '\0')) && ((*pbVar10 & 2) != 0)) {
          arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
          pbVar10 = (byte *)argtable[iVar21];
        }
        if (*(code **)(pbVar10 + 0x40) != (code *)0x0) {
          iVar21 = (**(code **)(pbVar10 + 0x40))(pvVar20,optarg);
joined_r0x00106c68:
          if (iVar21 != 0) {
            arg_register_error(endtable,pvVar20,iVar21,optarg);
          }
        }
        goto LAB_00106b5b;
      }
      if (iVar21 == 0x3a) {
        arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
        goto LAB_00106b5b;
      }
      if (iVar21 == 0x3f) {
        if (optopt == 0) {
          arg_register_error(endtable,endtable,4,nargv[(long)optind + -1]);
        }
        else {
          arg_register_error(endtable,endtable,optopt,(char *)0x0);
        }
        goto LAB_00106b5b;
      }
      if (iVar21 != -1) {
        lVar4 = 0;
        for (ppvVar11 = argtable; (**ppvVar11 & 1) == 0; ppvVar11 = ppvVar11 + 1) {
          pcVar15 = *(char **)((long)*ppvVar11 + 8);
          if ((pcVar15 != (char *)0x0) &&
             (pcVar15 = strchr(pcVar15,(int)(char)iVar21), pcVar15 != (char *)0x0)) {
            lVar4 = *(long *)((long)argtable + (lVar4 >> 0x1d));
            pcVar2 = *(code **)(lVar4 + 0x40);
            if (pcVar2 == (code *)0x0) goto LAB_00106b5b;
            pvVar20 = *(void **)(lVar4 + 0x30);
            iVar21 = (*pcVar2)(pvVar20,optarg);
            goto joined_r0x00106c68;
          }
          lVar4 = lVar4 + 0x100000000;
        }
        arg_register_error(endtable,endtable,iVar21,(char *)0x0);
        goto LAB_00106b5b;
      }
      goto LAB_00106d4c;
    }
  }
  arg_register_error(endtable,endtable,2,(char *)0x0);
LAB_00106d4c:
  free(pcVar8);
  free(__ptr);
  pcVar8 = (char *)0x0;
  iVar21 = 0;
  uVar5 = 0;
  pvVar20 = (void *)0x0;
LAB_00106d67:
  uVar5 = (ulong)(int)uVar5;
  do {
    pbVar10 = (byte *)argtable[uVar5];
    if ((*pbVar10 & 1) != 0) {
      if (iVar21 != 0) {
        arg_register_error(endtable,pvVar20,iVar21,pcVar8);
        optind = optind + 1;
      }
      while (lVar4 = (long)optind, optind < argc) {
        optind = optind + 1;
        arg_register_error(endtable,endtable,3,nargv[lVar4]);
      }
LAB_00106e3b:
      if (endtable->count == 0) {
        arg_parse_check((arg_hdr **)argtable,endtable);
      }
      free(nargv);
      goto LAB_00106e5e;
    }
    if (argc <= optind) goto LAB_00106e3b;
    if (((*(long *)(pbVar10 + 0x10) == 0) && (*(long *)(pbVar10 + 8) == 0)) &&
       (*(code **)(pbVar10 + 0x40) != (code *)0x0)) break;
    uVar5 = uVar5 + 1;
  } while( true );
  pvVar3 = *(void **)(pbVar10 + 0x30);
  iVar21 = (**(code **)(pbVar10 + 0x40))(pvVar3,nargv[optind]);
  if (iVar21 == 0) {
    optind = optind + 1;
    iVar21 = 0;
  }
  else {
    uVar5 = (ulong)((int)uVar5 + 1);
    pcVar8 = nargv[optind];
    pvVar20 = pvVar3;
  }
  goto LAB_00106d67;
}

Assistant:

int arg_parse(int argc, char * *argv, void * *argtable) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	struct arg_end * endtable;
	int endindex;
	char * *argvcopy = NULL;

	/*printf("arg_parse(%d,%p,%p)\n",argc,argv,argtable);*/

	/* reset any argtable data from previous invocations */
	arg_reset(argtable);

	/* locate the first end-of-table marker within the array */
	endindex = arg_endindex(table);
	endtable = (struct arg_end *)table[endindex];

	/* Special case of argc==0.  This can occur on Texas Instruments DSP. */
	/* Failure to trap this case results in an unwanted NULL result from  */
	/* the malloc for argvcopy (next code block).                         */
	if (argc == 0) {
		/* We must still perform post-parse checks despite the absence of command line arguments */
		arg_parse_check(table, endtable);

		/* Now we are finished */
		return endtable->count;
	}

	argvcopy = (char **)malloc(sizeof(char *) * (argc + 1));

	if (argvcopy) {
		int i;

		/*
		   Fill in the local copy of argv[]. We need a local copy
		   because getopt rearranges argv[] which adversely affects
		   susbsequent parsing attempts.
		 */
		for (i = 0; i < argc; i++) {
			argvcopy[i] = argv[i];
		}

		argvcopy[argc] = NULL;

		/* parse the command line (local copy) for tagged options */
		arg_parse_tagged(argc, argvcopy, table, endtable);

		/* parse the command line (local copy) for untagged options */
		arg_parse_untagged(argc, argvcopy, table, endtable);

		/* if no errors so far then perform post-parse checks otherwise dont bother */
		if (endtable->count == 0) {
			arg_parse_check(table, endtable);
		}

		/* release the local copt of argv[] */
		free(argvcopy);
	} else {
		/* memory alloc failed */
		arg_register_error(endtable, endtable, ARG_EMALLOC, NULL);
	}

	return endtable->count;
}